

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

bool amrex::anon_unknown_12::anon_unknown_0::squeryarr<float>
               (Table *table,string *name,vector<float,_std::allocator<float>_> *ptr,int start_ix,
               int num_val,int occurrence)

{
  pointer pbVar1;
  PP_entry *pPVar2;
  bool bVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  size_type __new_size;
  char local_5a [2];
  int local_58;
  char local_52 [2];
  PP_entry *local_50;
  vector<float,_std::allocator<float>_> *local_48;
  size_type local_40;
  pointer local_38;
  
  local_48 = ptr;
  local_50 = ppindex(table,occurrence,name,false);
  if (local_50 != (PP_entry *)0x0) {
    if (num_val == -1) {
      num_val = (int)((ulong)((long)(local_50->m_vals).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_50->m_vals).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
    }
    if (num_val != 0) {
      iVar8 = start_ix + num_val;
      __new_size = (size_type)iVar8;
      local_58 = occurrence;
      if ((int)((ulong)(*(long *)(local_48 + 8) - *(long *)local_48) >> 2) < iVar8) {
        std::vector<float,_std::allocator<float>_>::resize(local_48,__new_size);
      }
      if ((int)((ulong)((long)(local_50->m_vals).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_50->m_vals).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) < iVar8) {
        poVar4 = ErrorStream();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"ParmParse::queryarr too many values requested for",0x31);
        poVar4 = ErrorStream();
        iVar8 = local_58;
        if (local_58 == -1) {
          pcVar9 = " last occurrence of ";
          lVar6 = 0x14;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," occurrence ",0xc);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
          pcVar9 = " of ";
          lVar6 = 4;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,lVar6);
        poVar4 = ErrorStream();
        pPVar2 = local_50;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(local_50->m_name)._M_dataplus._M_p,
                            (local_50->m_name)._M_string_length);
        local_52[0] = '\n';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_52,1);
        amrex::operator<<(poVar4,pPVar2);
        local_52[1] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_52 + 1,1);
        Abort_host((char *)0x0);
      }
      if (0 < num_val) {
        lVar10 = (long)start_ix;
        lVar11 = lVar10 << 5;
        lVar6 = lVar10 * 4;
        iVar8 = local_58;
        local_40 = __new_size;
        do {
          pbVar1 = (local_50->m_vals).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar3 = is<float>((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar11),
                            (float *)(*(long *)local_48 + lVar6));
          if (!bVar3) {
            local_38 = pbVar1;
            poVar4 = ErrorStream();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"ParmParse::queryarr type mismatch on value number ",0x32);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," of ",4);
            poVar4 = ErrorStream();
            if (iVar8 == -1) {
              lVar7 = 0x14;
              pcVar9 = " last occurrence of ";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," occurrence number ",0x13);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
              lVar7 = 4;
              pcVar9 = " of ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,lVar7);
            poVar4 = ErrorStream();
            pPVar2 = local_50;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(local_50->m_name)._M_dataplus._M_p,
                                (local_50->m_name)._M_string_length);
            local_5a[0] = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5a,1);
            poVar4 = ErrorStream();
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," Expected an \"",0xe);
            pcVar9 = _fread + (*_fread == '*');
            sVar5 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar9,sVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"\" type which can\'t be parsed from the string \"",0x2e);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,*(char **)((long)&(local_38->_M_dataplus)._M_p + lVar11),
                                *(long *)((long)&local_38->_M_string_length + lVar11));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
            amrex::operator<<(poVar4,pPVar2);
            local_5a[1] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_5a + 1,1);
            Abort_host((char *)0x0);
            __new_size = local_40;
            iVar8 = local_58;
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x20;
          lVar6 = lVar6 + 4;
        } while (lVar10 < (long)__new_size);
      }
    }
  }
  return local_50 != (PP_entry *)0x0;
}

Assistant:

bool
squeryarr (const ParmParse::Table& table,
           const std::string& name,
           std::vector<T>&    ptr,
           int          start_ix,
           int          num_val,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry *def = ppindex(table,occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have sufficient number of values and are they all
    // the same type?
    //
    if ( num_val == ParmParse::ALL )
    {
        num_val = def->m_vals.size();
    }

    if ( num_val == 0 ) return true;

    int stop_ix = start_ix + num_val - 1;
    if ( static_cast<int>(ptr.size()) <= stop_ix )
    {
        ptr.resize(stop_ix + 1);
    }
    if ( stop_ix >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryarr too many values requested for";
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }
    for ( int n = start_ix; n <= stop_ix; n++ )
    {
        const std::string& valname = def->m_vals[n];
        bool ok = is(valname, ptr[n]);
        if ( !ok )
        {
            amrex::ErrorStream() << "ParmParse::queryarr type mismatch on value number "
                      <<  n << " of ";
            if ( occurrence == ParmParse::LAST )
            {
                amrex::ErrorStream() << " last occurrence of ";
            }
            else
            {
                amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
            }
            amrex::ErrorStream() << def->m_name << '\n';
            amrex::ErrorStream() << " Expected an \""
                      << tok_name(ptr)
                      << "\" type which can't be parsed from the string \""
                      << valname << "\"\n"
                      << *def << '\n';
            amrex::Abort();
        }
    }
    return true;
}